

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<RCCFileInfo*>::
appendIteratorRange<QMultiHash<QString,RCCFileInfo*>::const_iterator>
          (QCommonArrayOps<RCCFileInfo*> *this,const_iterator b,const_iterator e,
          IfIsForwardIterator<QMultiHash<QString,_RCCFileInfo_*>::const_iterator> param_3)

{
  Chain *pCVar1;
  undefined8 *puVar2;
  
  if (b.e != e.e) {
    puVar2 = (undefined8 *)(*(long *)(this + 0x10) * 8 + *(long *)(this + 8));
    do {
      *puVar2 = (*b.e)->value;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      pCVar1 = *b.e;
      b.e = &pCVar1->next;
      if (pCVar1->next == (MultiNodeChain<RCCFileInfo_*> *)0x0) {
        QHashPrivate::iterator<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_>::operator++(&b.i);
        if (b.i.d == (Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> *)0x0) {
          b.e = (Chain **)0x0;
        }
        else {
          b.e = (Chain **)
                ((b.i.d)->spans[b.i.bucket >> 7].entries
                 [(b.i.d)->spans[b.i.bucket >> 7].offsets[(uint)b.i.bucket & 0x7f]].storage.data +
                0x18);
        }
      }
      puVar2 = puVar2 + 1;
    } while (b.e != e.e);
  }
  return;
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }